

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhitm.c
# Opt level: O1

boolean attack_checks(monst *mtmp,obj *wep,schar dx,schar dy,boolean kicking)

{
  byte *pbVar1;
  uint uVar2;
  boolean bVar3;
  char cVar4;
  int iVar5;
  obj *poVar6;
  char *pcVar7;
  char *pcVar8;
  char qbuf [128];
  char local_b8 [136];
  
  pbVar1 = (byte *)((long)&mtmp->mstrategy + 3);
  *pbVar1 = *pbVar1 & 0xcf;
  if (u.ustuck == mtmp && (u._1052_1_ & 1) != 0) {
    return '\0';
  }
  if (flags.forcefight != '\0') {
    return '\0';
  }
  if (mtmp->wormno == '\0') {
    if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
       (((((u.uprops[0x1e].intrinsic == 0 &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
         ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
          (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
        (((viz_array[mtmp->my][mtmp->mx] & 1U) != 0 && ((mtmp->data->mflags3 & 0x200) != 0))))))
    goto LAB_002703bb;
LAB_00270406:
    if (((((mtmp->data->mflags1 & 0x10000) == 0) &&
         ((poVar6 = which_armor(mtmp,4), poVar6 == (obj *)0x0 ||
          (poVar6 = which_armor(mtmp,4), poVar6->otyp != 0x4f)))) &&
        ((((u.uprops[0x1e].intrinsic != 0 ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
           ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32 && (u.uprops[0x19].blocked == 0)))))) ||
         (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
          (iVar5 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar5 < 0x41)))))) ||
       (((((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
          (bVar3 = match_warn_of_mon(mtmp), bVar3 != '\0')) ||
         ((bVar3 = warning_at((int)dx + (int)u.ux,(int)dy + (int)u.uy), bVar3 != '\0' ||
          ((level->locations[(long)dx + (long)u.ux][(long)dy + (long)u.uy].field_0x6 & 8) != 0))))
        || (((((u.uprops[0x1e].intrinsic == 0 &&
               ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
            (((mtmp->field_0x60 & 0x80) != 0 && ((mtmp->data->mflags1 & 0x80) != 0))))))))
    goto LAB_00270670;
    pline("Wait!  There\'s something there you can\'t see!");
    map_invisible(dx + u.ux,dy + u.uy);
    if ((((mtmp->m_ap_type != '\0') && (u.uprops[0x17].intrinsic == 0)) &&
        (u.uprops[0x17].extrinsic == 0)) &&
       (((u.ustuck == (monst *)0x0 && ((mtmp->field_0x62 & 1) == 0)) &&
        (bVar3 = dmgtype(mtmp->data,0x13), bVar3 != '\0')))) {
      u.ustuck = mtmp;
    }
    wakeup(mtmp);
LAB_00271037:
    bVar3 = '\x01';
  }
  else {
    bVar3 = worm_known(level,mtmp);
    if (bVar3 == '\0') goto LAB_00270406;
LAB_002703bb:
    uVar2 = *(uint *)&mtmp->field_0x60;
    if ((((uVar2 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)) {
      if (((uVar2 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_002703f9;
      goto LAB_00270406;
    }
    if ((uVar2 & 0x280) != 0) goto LAB_00270406;
LAB_002703f9:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_00270406;
LAB_00270670:
    if (((((mtmp->m_ap_type == '\0') || (u.uprops[0x17].intrinsic != 0)) ||
         (u.uprops[0x17].extrinsic != 0)) ||
        ((((mtmp->data->mflags1 & 0x10000) == 0 &&
          ((poVar6 = which_armor(mtmp,4), poVar6 == (obj *)0x0 ||
           (poVar6 = which_armor(mtmp,4), poVar6->otyp != 0x4f)))) &&
         ((((u.uprops[0x1e].intrinsic != 0 ||
            (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
             (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
           (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
            ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
              (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
              youmonst.data == mons + 0x32 && (u.uprops[0x19].blocked == 0)))))) ||
          (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
           (iVar5 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar5 < 0x41)))))))) ||
       ((((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
         (bVar3 = match_warn_of_mon(mtmp), bVar3 != '\0')) ||
        (bVar3 = warning_at((int)u.ux + (int)dx,(int)u.uy + (int)dy), bVar3 != '\0')))) {
      if ((mtmp->field_0x60 & 0x80) != 0) {
        if (mtmp->wormno == '\0') {
          if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
             ((((((u.uprops[0x1e].intrinsic == 0 &&
                  ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                 (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
               ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
              (((viz_array[mtmp->my][mtmp->mx] & 1U) != 0 && ((mtmp->data->mflags3 & 0x200) != 0))))
             )) goto LAB_002708c5;
        }
        else {
          bVar3 = worm_known(level,mtmp);
          if (bVar3 != '\0') {
LAB_002708c5:
            uVar2 = *(uint *)&mtmp->field_0x60;
            if ((((uVar2 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((uVar2 & 0x280) == 0) goto LAB_00270903;
            }
            else if (((uVar2 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_00270903:
              if ((u._1052_1_ & 0x20) == 0) goto LAB_0027092d;
            }
          }
        }
        bVar3 = warning_at((int)dx + (int)u.ux,(int)dy + (int)u.uy);
        if ((bVar3 == '\0') && (((mtmp->data->mflags1 & 0x80) != 0 || (mtmp->data->mlet == '9')))) {
          *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfff7ff7f;
          newsym((int)mtmp->mx,(int)mtmp->my);
          if ((level->locations[mtmp->mx][mtmp->my].field_0x6 & 8) != 0) goto LAB_00270d3b;
          if (((u.uprops[0x1e].intrinsic == 0) &&
              (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            if (u.uprops[0x19].extrinsic != 0) goto LAB_00270c63;
          }
          else if (((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                   (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                   youmonst.data == mons + 0x32) {
LAB_00270c63:
            if (u.uprops[0x19].blocked == 0) goto LAB_0027092d;
          }
          if (((((u.uprops[0x1e].intrinsic == 0) &&
                ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
              ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
             ((bVar3 = is_pool(level,(int)mtmp->mx,(int)mtmp->my), bVar3 == '\0' ||
              ((u._1052_1_ & 2) != 0)))) {
            poVar6 = level->objects[mtmp->mx][mtmp->my];
            if (poVar6 == (obj *)0x0) {
              return '\x01';
            }
            pcVar8 = l_monnam(mtmp);
            pcVar8 = an(pcVar8);
            pcVar7 = doname(poVar6);
            pline("Wait!  There\'s %s hiding under %s!",pcVar8,pcVar7);
            return '\x01';
          }
          pline("Wait!  There\'s a hidden monster there!");
          goto LAB_00271037;
        }
      }
LAB_0027092d:
      if ((((mtmp->field_0x60 & 0x80) != 0) || (mtmp->m_ap_type != '\0')) &&
         (((((mtmp->data->mflags1 & 0x10000) == 0 &&
            ((poVar6 = which_armor(mtmp,4), poVar6 == (obj *)0x0 ||
             (poVar6 = which_armor(mtmp,4), poVar6->otyp != 0x4f)))) &&
           ((((u.uprops[0x1e].intrinsic != 0 ||
              (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
               (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
             (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
              ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                youmonst.data == mons + 0x32 && (u.uprops[0x19].blocked == 0)))))) ||
            (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
             (iVar5 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar5 < 0x41)))))) ||
          (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
           (bVar3 = match_warn_of_mon(mtmp), bVar3 != '\0')))))) {
        mtmp->field_0x60 = mtmp->field_0x60 & 0x7f;
        wakeup(mtmp);
      }
      if (flags.safe_peaceful != 'n') {
        if ((mtmp->field_0x62 & 0x40) == 0) {
          return '\0';
        }
        if (u.uprops[0x1c].intrinsic != 0) {
          return '\0';
        }
        if ((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) {
          if (u.uprops[0x1b].intrinsic == 0) goto LAB_00270bed;
        }
        else if (u.umonnum != u.umonster) {
          bVar3 = dmgtype(youmonst.data,0x24);
          if (bVar3 == '\0') {
            return '\0';
          }
          if (u.uprops[0x1b].intrinsic != 0) {
            return '\0';
          }
LAB_00270bed:
          if ((u.umonnum != 0x9e) && ((youmonst.data)->mlet != '\x1c')) {
            if ((wep == (obj *)0x0) || (wep->oartifact != '\x03')) {
              if (mtmp->wormno == '\0') {
                if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
                   (((((u.uprops[0x1e].intrinsic == 0 &&
                       (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                        (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                      ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                     ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                      (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
                    (((viz_array[mtmp->my][mtmp->mx] & 1U) != 0 &&
                     ((mtmp->data->mflags3 & 0x200) != 0)))))) goto LAB_00270e30;
LAB_00270e74:
                if (((((mtmp->data->mflags1 & 0x10000) != 0) ||
                     ((poVar6 = which_armor(mtmp,4), poVar6 != (obj *)0x0 &&
                      (poVar6 = which_armor(mtmp,4), poVar6->otyp == 0x4f)))) ||
                    ((((u.uprops[0x1e].intrinsic == 0 &&
                       (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                        (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                      (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
                       ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
                         (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
                         youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) &&
                     (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
                      (iVar5 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar5)
                      ))))) &&
                   (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
                    (bVar3 = match_warn_of_mon(mtmp), bVar3 == '\0')))) goto LAB_00270b73;
              }
              else {
                bVar3 = worm_known(level,mtmp);
                if (bVar3 == '\0') goto LAB_00270e74;
LAB_00270e30:
                uVar2 = *(uint *)&mtmp->field_0x60;
                if ((((uVar2 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
                   (u.uprops[0xc].extrinsic == 0)) {
                  if (((uVar2 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
                  goto LAB_00270e67;
                  goto LAB_00270e74;
                }
                if ((uVar2 & 0x280) != 0) goto LAB_00270e74;
LAB_00270e67:
                if ((u._1052_1_ & 0x20) != 0) goto LAB_00270e74;
              }
              if (flags.safe_peaceful == 'y' && kicking == '\0') {
                pcVar8 = mon_nam(mtmp);
                pline("You stop for %s.",pcVar8);
              }
              else {
                if ((flags.safe_peaceful != 'a') && (kicking == '\0' || flags.safe_peaceful != 'y'))
                goto LAB_00270b73;
                pcVar8 = mon_nam(mtmp);
                sprintf(local_b8,"Really attack %s?",pcVar8);
                cVar4 = paranoid_yn(local_b8,iflags.paranoid_hit);
                if (cVar4 == 'y') {
                  return '\0';
                }
              }
              flags.move = '\0';
              goto LAB_00271037;
            }
            override_confirmation = 1;
          }
        }
      }
    }
    else {
      if ((level->locations[mtmp->mx][mtmp->my].field_0x6 & 8) == 0) {
        stumble_onto_mimic(mtmp,dx,dy);
        goto LAB_00271037;
      }
LAB_00270d3b:
      seemimic(mtmp);
    }
LAB_00270b73:
    bVar3 = '\0';
  }
  return bVar3;
}

Assistant:

boolean attack_checks(struct monst *mtmp,
		      struct obj *wep,/* uwep for attack(), null for kick_monster() */
		      schar dx, schar dy,
		      boolean kicking)
{
	char qbuf[QBUFSZ];

	/* if you're close enough to attack, alert any waiting monster */
	mtmp->mstrategy &= ~STRAT_WAITMASK;

	if (u.uswallow && mtmp == u.ustuck) return FALSE;

	if (flags.forcefight) {
		/* Do this in the caller, after we checked that the monster
		 * didn't die from the blow.  Reason: putting the 'I' there
		 * causes the hero to forget the square's contents since
		 * both 'I' and remembered contents are stored in .glyph.
		 * If the monster dies immediately from the blow, the 'I' will
		 * not stay there, so the player will have suddenly forgotten
		 * the square's contents for no apparent reason.
		if (!canspotmon(mtmp) &&
		    !level->locations[u.ux+u.dx][u.uy+u.dy].mem_invis)
			map_invisible(u.ux+u.dx, u.uy+u.dy);
		 */
		return FALSE;
	}

	/* Put up an invisible monster marker, but with exceptions for
	 * monsters that hide and monsters you've been warned about.
	 * The former already prints a warning message and
	 * prevents you from hitting the monster just via the hidden monster
	 * code below; if we also did that here, similar behavior would be
	 * happening two turns in a row.  The latter shows a glyph on
	 * the screen, so you know something is there.
	 */
	if (!canspotmon(level, mtmp) &&
		    !warning_at(u.ux+dx, u.uy+dy) &&
		    !level->locations[u.ux+dx][u.uy+dy].mem_invis &&
		    !(!Blind && mtmp->mundetected && hides_under(mtmp->data))) {
		pline("Wait!  There's something there you can't see!");
		map_invisible(u.ux+dx, u.uy+dy);
		/* if it was an invisible mimic, treat it as if we stumbled
		 * onto a visible mimic
		 */
		if (mtmp->m_ap_type && !Protection_from_shape_changers) {
		    if (!u.ustuck && !mtmp->mflee && dmgtype(mtmp->data,AD_STCK))
			u.ustuck = mtmp;
		}
		wakeup(mtmp); /* always necessary; also un-mimics mimics */
		return TRUE;
	}

	if (mtmp->m_ap_type && !Protection_from_shape_changers &&
	   !sensemon(mtmp) &&
	   !warning_at(u.ux+dx, u.uy+dy)) {
		/* If a hidden mimic was in a square where a player remembers
		 * some (probably different) unseen monster, the player is in
		 * luck--he attacks it even though it's hidden.
		 */
		if (level->locations[mtmp->mx][mtmp->my].mem_invis) {
		    seemimic(mtmp);
		    return FALSE;
		}
		stumble_onto_mimic(mtmp, dx, dy);
		return TRUE;
	}

	if (mtmp->mundetected && !canseemon(level, mtmp) &&
		!warning_at(u.ux+dx, u.uy+dy) &&
		(hides_under(mtmp->data) || mtmp->data->mlet == S_EEL)) {
	    mtmp->mundetected = mtmp->msleeping = 0;
	    newsym(mtmp->mx, mtmp->my);
	    if (level->locations[mtmp->mx][mtmp->my].mem_invis) {
		seemimic(mtmp);
		return FALSE;
	    }
	    if (!(Blind ? Blind_telepat : Unblind_telepat)) {
		struct obj *obj;

		if (Blind || (is_pool(level, mtmp->mx,mtmp->my) && !Underwater))
		    pline("Wait!  There's a hidden monster there!");
		else if ((obj = level->objects[mtmp->mx][mtmp->my]) != 0)
		    pline("Wait!  There's %s hiding under %s!",
			  an(l_monnam(mtmp)), doname(obj));
		return TRUE;
	    }
	}

	/*
	 * make sure to wake up a monster from the above cases if the
	 * hero can sense that the monster is there.
	 */
	if ((mtmp->mundetected || mtmp->m_ap_type) && sensemon(mtmp)) {
	    mtmp->mundetected = 0;
	    wakeup(mtmp);
	}

	if (flags.safe_peaceful != 'n' && mtmp->mpeaceful
	    && !Confusion && !Hallucination && !Stunned) {
		/* Intelligent chaotic weapons (Stormbringer) want blood */
		if (wep && wep->oartifact == ART_STORMBRINGER) {
			override_confirmation = TRUE;
			return FALSE;
		}
		if (canspotmon(level, mtmp)) {
			boolean call_off_harm = FALSE;
			if (flags.safe_peaceful == 'y' && !kicking) {
				pline("You stop for %s.", mon_nam(mtmp));
				call_off_harm = TRUE;
			} else if (flags.safe_peaceful == 'a' ||
				   (flags.safe_peaceful == 'y' && kicking)) {
				sprintf(qbuf, "Really attack %s?", mon_nam(mtmp));
				if (paranoid_yn(qbuf, iflags.paranoid_hit) != 'y')
					call_off_harm = TRUE;
			}
			if (call_off_harm) {
				flags.move = 0;
				return TRUE;
			}
		}
	}

	return FALSE;
}